

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_32f1a0::ElaboratedTypeSpefType::printLeft
          (ElaboratedTypeSpefType *this,OutputStream *S)

{
  OutputStream *S_local;
  ElaboratedTypeSpefType *this_local;
  
  OutputStream::operator+=(S,this->Kind);
  OutputStream::operator+=(S,' ');
  Node::print(this->Child,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += Kind;
    S += ' ';
    Child->print(S);
  }